

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_deconstruction.h
# Opt level: O0

CalAdxl345BusData * __thiscall
ximu::PacketDeconstruction::
deconstructCalAdxl345BusData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (CalAdxl345BusData *__return_storage_ptr__,PacketDeconstruction *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          begin,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                end)

{
  uchar uVar1;
  reference puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector3<float> local_50;
  Vector3<float> local_44;
  Vector3<float> local_38;
  Vector3<float> local_2c;
  uchar *local_20;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  end_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  begin_local;
  
  local_20 = begin._M_current;
  end_local._M_current = (uchar *)this;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,1);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,2);
  fVar3 = FixedFloat::toFloat(uVar1,*puVar2,CALIBRATED_ADXL_345);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,3);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,4);
  fVar4 = FixedFloat::toFloat(uVar1,*puVar2,CALIBRATED_ADXL_345);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,5);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,6);
  fVar5 = FixedFloat::toFloat(uVar1,*puVar2,CALIBRATED_ADXL_345);
  Vector3<float>::Vector3(&local_2c,fVar3,fVar4,fVar5);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,7);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,8);
  fVar3 = FixedFloat::toFloat(uVar1,*puVar2,CALIBRATED_ADXL_345);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,9);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,10);
  fVar4 = FixedFloat::toFloat(uVar1,*puVar2,CALIBRATED_ADXL_345);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0xb);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0xc);
  fVar5 = FixedFloat::toFloat(uVar1,*puVar2,CALIBRATED_ADXL_345);
  Vector3<float>::Vector3(&local_38,fVar3,fVar4,fVar5);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0xd);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0xe);
  fVar3 = FixedFloat::toFloat(uVar1,*puVar2,CALIBRATED_ADXL_345);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0xf);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0x10);
  fVar4 = FixedFloat::toFloat(uVar1,*puVar2,CALIBRATED_ADXL_345);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0x11);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0x12);
  fVar5 = FixedFloat::toFloat(uVar1,*puVar2,CALIBRATED_ADXL_345);
  Vector3<float>::Vector3(&local_44,fVar3,fVar4,fVar5);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0x13);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0x14);
  fVar3 = FixedFloat::toFloat(uVar1,*puVar2,CALIBRATED_ADXL_345);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0x15);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0x16);
  fVar4 = FixedFloat::toFloat(uVar1,*puVar2,CALIBRATED_ADXL_345);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0x17);
  uVar1 = *puVar2;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&end_local,0x18);
  fVar5 = FixedFloat::toFloat(uVar1,*puVar2,CALIBRATED_ADXL_345);
  Vector3<float>::Vector3(&local_50,fVar3,fVar4,fVar5);
  CalAdxl345BusData::CalAdxl345BusData
            (__return_storage_ptr__,&local_2c,&local_38,&local_44,&local_50);
  return __return_storage_ptr__;
}

Assistant:

static CalAdxl345BusData deconstructCalAdxl345BusData(
    InputIterator begin, InputIterator end)
  {
    return CalAdxl345BusData(
      Vector3f(
	FixedFloat::toFloat(begin[1],begin[2],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[3],begin[4],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[5],begin[6],Qvals::CALIBRATED_ADXL_345)
      ),
      
      Vector3f(
	FixedFloat::toFloat(begin[7],begin[8],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[9],begin[10],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[11],begin[12],Qvals::CALIBRATED_ADXL_345)
      ),
      
      Vector3f(
	FixedFloat::toFloat(begin[13],begin[14],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[15],begin[16],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[17],begin[18],Qvals::CALIBRATED_ADXL_345)
      ),
      
      Vector3f(
	FixedFloat::toFloat(begin[19],begin[20],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[21],begin[22],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[23],begin[24],Qvals::CALIBRATED_ADXL_345)
      )
    );
  }